

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_GeometryShop.H
# Opt level: O2

void __thiscall
amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,_int>::updateIntercept
          (GeometryShop<amrex::EB2::PlaneIF,_int> *this,Array<Array4<Real>,_3> *inter_arr,
          Array<Array4<const_Type_t>,_3> *type_arr,Array4<const_double> *lst,Geometry *geom)

{
  Array4<double> *a;
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  uint *puVar16;
  double *pdVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  Array4<const_unsigned_int> *pAVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int idim;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  bool bVar41;
  double dVar42;
  Box bx;
  Box local_4c;
  
  dVar2 = (geom->super_CoordSys).dx[0];
  dVar3 = (geom->super_CoordSys).dx[1];
  dVar4 = (geom->super_CoordSys).dx[2];
  dVar5 = (geom->prob_domain).xlo[0];
  dVar6 = (geom->prob_domain).xlo[1];
  dVar7 = (geom->prob_domain).xlo[2];
  lVar25 = 0;
  do {
    if (lVar25 == 3) {
      return;
    }
    a = inter_arr->_M_elems + lVar25;
    pAVar21 = type_arr->_M_elems + lVar25;
    Box::Box<double>(&local_4c,a);
    lVar31 = (long)local_4c.smallend.vect[0];
    lVar1 = lVar31 * 8;
    lVar14 = (long)local_4c.smallend.vect[2];
    iVar29 = local_4c.smallend.vect[2];
    while( true ) {
      lVar20 = lVar14;
      iVar29 = iVar29 + 1;
      if (local_4c.bigend.vect[2] < (int)lVar20) break;
      dVar37 = (double)(int)lVar20 * dVar4 + dVar7;
      dVar38 = (double)(int)(lVar20 + 1) * dVar4 + dVar7;
      iVar19 = local_4c.smallend.vect[1];
      while (iVar30 = iVar19, lVar14 = lVar20 + 1, iVar30 <= local_4c.bigend.vect[1]) {
        if (local_4c.bigend.vect[0] < local_4c.smallend.vect[0]) {
          iVar19 = iVar30 + 1;
        }
        else {
          iVar10 = (pAVar21->begin).x;
          iVar11 = (pAVar21->begin).y;
          iVar12 = (pAVar21->begin).z;
          iVar13 = (lst->begin).y;
          iVar19 = iVar30 + 1;
          lVar23 = (long)(lst->begin).z;
          lVar14 = pAVar21->kstride;
          lVar15 = pAVar21->jstride;
          puVar16 = pAVar21->p;
          lVar34 = lst->jstride * 8;
          lVar26 = (iVar30 - iVar13) * lVar34;
          lVar35 = lst->kstride * 8;
          lVar22 = (lVar20 - lVar23) * lVar35;
          lVar27 = (long)(lst->begin).x;
          dVar39 = (double)iVar30 * dVar3 + dVar6;
          dVar40 = (double)iVar19 * dVar3 + dVar6;
          pdVar17 = lst->p;
          lVar18 = lVar22 + lVar26 + lVar27 * -8 + lVar1;
          lVar28 = 0;
          do {
            if (puVar16[lVar31 + (((lVar20 - iVar12) * lVar14 + (iVar30 - iVar11) * lVar15 + lVar28)
                                 - (long)iVar10)] == 2) {
              lVar24 = (long)(a->begin).x;
              lVar33 = (lVar20 - (a->begin).z) * a->kstride;
              lVar36 = ((long)iVar30 - (long)(a->begin).y) * a->jstride;
              dVar8 = a->p[(lVar33 + lVar36 + lVar31 + lVar28) - lVar24];
              if ((int)lVar25 == 1) {
                dVar9 = *(double *)((long)pdVar17 + lVar28 * 8 + lVar18);
                dVar42 = dVar39;
                if (((dVar9 != 0.0) || (NAN(dVar9))) && (dVar9 <= 0.0 || !NAN(dVar8))) {
                  dVar9 = *(double *)
                           ((long)pdVar17 +
                           lVar28 * 8 + lVar34 * (iVar19 - iVar13) + lVar22 + lVar27 * -8 + lVar1);
                  dVar42 = dVar40;
                  if ((dVar9 != 0.0) || (NAN(dVar9))) {
                    bVar41 = !NAN(dVar8) || dVar9 <= 0.0;
LAB_004b87e8:
                    if (bVar41) goto LAB_004b880c;
                  }
                }
              }
              else if ((int)lVar25 == 0) {
                dVar9 = *(double *)((long)pdVar17 + lVar28 * 8 + lVar18);
                if (((dVar9 == 0.0) && (!NAN(dVar9))) || (0.0 < dVar9 && NAN(dVar8))) {
                  iVar32 = local_4c.smallend.vect[0] + (int)lVar28;
                }
                else {
                  dVar9 = *(double *)((long)pdVar17 + lVar28 * 8 + lVar18 + 8);
                  if (((dVar9 != 0.0) || (NAN(dVar9))) && (!NAN(dVar8) || dVar9 <= 0.0))
                  goto LAB_004b880c;
                  iVar32 = local_4c.smallend.vect[0] + (int)lVar28 + 1;
                }
                dVar42 = (double)iVar32 * dVar2 + dVar5;
              }
              else {
                dVar9 = *(double *)((long)pdVar17 + lVar28 * 8 + lVar18);
                dVar42 = dVar37;
                if (((dVar9 != 0.0) || (NAN(dVar9))) && (dVar9 <= 0.0 || !NAN(dVar8))) {
                  dVar9 = *(double *)
                           ((long)pdVar17 +
                           lVar28 * 8 + (iVar29 - lVar23) * lVar35 + lVar26 + lVar27 * -8 + lVar1);
                  dVar42 = dVar38;
                  if ((dVar9 != 0.0) || (NAN(dVar9))) {
                    bVar41 = !NAN(dVar8) || dVar9 <= 0.0;
                    goto LAB_004b87e8;
                  }
                }
              }
              a->p[(lVar33 + lVar36 + lVar31 + lVar28) - lVar24] = dVar42;
            }
LAB_004b880c:
            lVar28 = lVar28 + 1;
          } while (~local_4c.bigend.vect[0] + local_4c.smallend.vect[0] + (int)lVar28 != 0);
        }
      }
    }
    lVar25 = lVar25 + 1;
  } while( true );
}

Assistant:

void updateIntercept (Array<Array4<Real>,AMREX_SPACEDIM> const& inter_arr,
                          Array<Array4<Type_t const>,AMREX_SPACEDIM> const& type_arr,
                          Array4<Real const> const& lst, Geometry const& geom) const noexcept
    {
        auto const& dx = geom.CellSizeArray();
        auto const& problo = geom.ProbLoArray();
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            Array4<Real> const& inter = inter_arr[idim];
            Array4<Type_t const> const& type = type_arr[idim];
            const Box bx{inter};
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
            {
                if (type(i,j,k) == Type::irregular) {
                    bool is_nan = amrex::isnan(inter(i,j,k));
                    if (idim == 0) {
                        if (lst(i,j,k) == Real(0.0) ||
                            (lst(i,j,k) > Real(0.0) && is_nan))
                        {
                            // interp might still be quiet_nan because lst that
                            // was set to zero has been changed by FillBoundary
                            // at periodic bounadries.
                            inter(i,j,k) = problo[0] + i*dx[0];
                        }
                        else if (lst(i+1,j,k) == Real(0.0) ||
                                 (lst(i+1,j,k) > Real(0.0) && is_nan))
                        {
                            inter(i,j,k) = problo[0] + (i+1)*dx[0];
                        }
                    } else if (idim == 1) {
                        if (lst(i,j,k) == Real(0.0) ||
                            (lst(i,j,k) > Real(0.0) && is_nan))
                        {
                            inter(i,j,k) = problo[1] + j*dx[1];
                        }
                        else if (lst(i,j+1,k) == Real(0.0) ||
                                 (lst(i,j+1,k) > Real(0.0) && is_nan))
                        {
                            inter(i,j,k) = problo[1] + (j+1)*dx[1];
                        }
                    } else {
                        if (lst(i,j,k) == Real(0.0) ||
                            (lst(i,j,k) > Real(0.0) && is_nan))
                        {
                            inter(i,j,k) = problo[2] + k*dx[2];
                        }
                        else if (lst(i,j,k+1) == Real(0.0) ||
                                 (lst(i,j,k+1) > Real(0.0) && is_nan))
                        {
                            inter(i,j,k) = problo[2] + (k+1)*dx[2];
                        }
                    }
                }
            });
        }
    }